

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O1

string * __thiscall
spoa::Graph::GenerateConsensus_abi_cxx11_
          (string *__return_storage_ptr__,Graph *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *summary,bool verbose)

{
  int *piVar1;
  pointer puVar2;
  pointer ppNVar3;
  iterator __position;
  pointer ppNVar4;
  void *pvVar5;
  uint32_t uVar6;
  pointer ppNVar7;
  Node *this_00;
  invalid_argument *this_01;
  undefined7 in_register_00000009;
  ulong uVar8;
  bool bVar9;
  Node **it;
  uint uVar10;
  uint *puVar11;
  ulong uVar12;
  ulong uVar13;
  Node **jt;
  ulong uVar14;
  pointer ppNVar15;
  vector<unsigned_int,_std::allocator<unsigned_int>_> node_id_to_column;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  if (summary == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_01,"[spoa::Graph::GenerateConsensus] error: invalid ptr to summary");
    __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  uVar12 = CONCAT71(in_register_00000009,verbose) & 0xffffffff;
  GenerateConsensus_abi_cxx11_(__return_storage_ptr__,this);
  puVar2 = (summary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((summary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (summary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  if ((char)uVar12 == '\0') {
    ppNVar7 = (this->consensus_).
              super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppNVar3 = (this->consensus_).
              super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppNVar7 != ppNVar3) {
      do {
        local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = 0;
        __position._M_current =
             (summary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (summary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<int>
                    (summary,__position,(int *)&local_48);
        }
        else {
          *__position._M_current = 0;
          (summary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        uVar6 = Node::Coverage(*ppNVar7);
        puVar2 = (summary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish + -1;
        *puVar2 = *puVar2 + uVar6;
        ppNVar4 = ((*ppNVar7)->aligned_nodes).
                  super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (ppNVar15 = ((*ppNVar7)->aligned_nodes).
                        super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppNVar15 != ppNVar4;
            ppNVar15 = ppNVar15 + 1) {
          uVar6 = Node::Coverage(*ppNVar15);
          puVar2 = (summary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_finish + -1;
          *puVar2 = *puVar2 + uVar6;
        }
        ppNVar7 = ppNVar7 + 1;
      } while (ppNVar7 != ppNVar3);
    }
  }
  else {
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (summary,((long)(this->consensus_).
                              super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->consensus_).
                              super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) *
                       (ulong)(this->num_codes_ + 1),(value_type_conflict1 *)&local_48);
    InitializeMultipleSequenceAlignment(&local_48,this,(uint32_t *)0x0);
    ppNVar7 = (this->sequences_).
              super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->sequences_).
        super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppNVar7) {
      uVar13 = 0;
LAB_00109521:
      this_00 = ppNVar7[uVar13];
      puVar11 = (uint *)((ulong)this_00->id * 4 +
                        CONCAT44(local_48.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 local_48.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._0_4_));
      uVar14 = 0;
      bVar9 = false;
      do {
        ppNVar7 = (this->consensus_).
                  super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        uVar8 = (long)(this->consensus_).
                      super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppNVar7 >> 3;
        if (uVar14 < uVar8) {
          do {
            uVar10 = *(uint *)(CONCAT44(local_48.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                        local_48.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                              (ulong)ppNVar7[uVar14]->id * 4);
            if (*puVar11 <= uVar10) {
              if (uVar10 == *puVar11) {
                if ((bVar9) && (uVar10 = (int)uVar12 + 1, uVar10 < (uint)uVar14)) {
                  puVar2 = (summary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  uVar12 = (ulong)uVar10;
                  do {
                    piVar1 = (int *)((long)puVar2 + uVar12 * 4 + (ulong)this->num_codes_ * uVar8 * 4
                                    );
                    *piVar1 = *piVar1 + 1;
                    uVar12 = uVar12 + 1;
                  } while (uVar12 < uVar14);
                }
                puVar2 = (summary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_start + this_00->code * uVar8 + uVar14;
                *puVar2 = *puVar2 + 1;
                bVar9 = true;
                uVar12 = uVar14;
              }
              break;
            }
            uVar14 = (ulong)((uint)uVar14 + 1);
          } while (uVar14 < uVar8);
        }
        if ((uVar8 == uVar14) ||
           (this_00 = Node::Successor(this_00,(uint32_t)uVar13), this_00 == (Node *)0x0))
        goto LAB_001095e5;
        puVar11 = (uint *)((ulong)this_00->id * 4 +
                          CONCAT44(local_48.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,
                                   local_48.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start._0_4_));
      } while( true );
    }
LAB_00109600:
    pvVar5 = (void *)CONCAT44(local_48.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              local_48.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start._0_4_);
    if (pvVar5 != (void *)0x0) {
      operator_delete(pvVar5,(long)local_48.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar5)
      ;
    }
  }
  return __return_storage_ptr__;
LAB_001095e5:
  uVar13 = (ulong)((uint32_t)uVar13 + 1);
  ppNVar7 = (this->sequences_).
            super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->sequences_).
                    super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)ppNVar7 >> 3) <= uVar13)
  goto LAB_00109600;
  goto LAB_00109521;
}

Assistant:

std::string Graph::GenerateConsensus(
    std::vector<std::uint32_t>* summary,
    bool verbose) {
  if (!summary) {
    throw std::invalid_argument(
        "[spoa::Graph::GenerateConsensus] error: invalid ptr to summary");
  }

  auto dst = GenerateConsensus();

  summary->clear();
  if (!verbose) {
    for (const auto& it : consensus_) {
      summary->emplace_back(0);
      summary->back() += it->Coverage();
      for (const auto& jt : it->aligned_nodes) {
        summary->back() += jt->Coverage();
      }
    }
  } else {
    summary->resize((num_codes_ + 1) * consensus_.size(), 0);
    auto node_id_to_column = InitializeMultipleSequenceAlignment();

    for (std::uint32_t i = 0; i < sequences_.size(); ++i) {
      Node* it = sequences_[i];
      std::uint32_t c = 0, p, column = node_id_to_column[it->id];
      bool is_gap = false;
      while (true) {
        for (; c < consensus_.size(); ++c) {
          if (node_id_to_column[consensus_[c]->id] < column) {
            continue;
          } else {
            if (node_id_to_column[consensus_[c]->id] == column) {
              if (is_gap) {
                for (std::uint32_t j = p + 1; j < c; ++j) {
                  ++(*summary)[num_codes_ * consensus_.size() + j];
                }
              }
              is_gap = true;
              p = c;
              ++(*summary)[it->code * consensus_.size() + c];
            }
            break;
          }
        }
        if (c == consensus_.size() || !(it = it->Successor(i))) {
          break;
        }
        column = node_id_to_column[it->id];
      }
    }
  }

  return dst;
}